

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

Matrix3x3 * CGL::Matrix3x3::identity(void)

{
  Matrix3x3 *in_RDI;
  
  Matrix3x3(in_RDI);
  in_RDI->entries[0].x = 1.0;
  in_RDI->entries[0].y = 0.0;
  in_RDI->entries[2].x = 0.0;
  in_RDI->entries[2].y = 0.0;
  in_RDI->entries[0].z = 0.0;
  in_RDI->entries[1].x = 0.0;
  in_RDI->entries[1].y = 1.0;
  in_RDI->entries[1].z = 0.0;
  in_RDI->entries[2].z = 1.0;
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::identity( void ) {
    Matrix3x3 B;

    B(0,0) = 1.; B(0,1) = 0.; B(0,2) = 0.;
    B(1,0) = 0.; B(1,1) = 1.; B(1,2) = 0.;
    B(2,0) = 0.; B(2,1) = 0.; B(2,2) = 1.;

    return B;
  }